

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ArrayJoinPromiseNode<int>::ArrayJoinPromiseNode
          (ArrayJoinPromiseNode<int> *this,Array<kj::Own<kj::_::PromiseNode>_> *promises,
          Array<kj::_::ExceptionOr<int>_> *resultParts)

{
  Array<kj::Own<kj::_::PromiseNode>_> *other;
  ExceptionOr<int> *resultParts_00;
  Array<kj::_::ExceptionOr<int>_> *other_00;
  Array<kj::Own<kj::_::PromiseNode>_> local_38;
  Array<kj::_::ExceptionOr<int>_> *local_20;
  Array<kj::_::ExceptionOr<int>_> *resultParts_local;
  Array<kj::Own<kj::_::PromiseNode>_> *promises_local;
  ArrayJoinPromiseNode<int> *this_local;
  
  local_20 = resultParts;
  resultParts_local = (Array<kj::_::ExceptionOr<int>_> *)promises;
  promises_local = (Array<kj::Own<kj::_::PromiseNode>_> *)this;
  other = mv<kj::Array<kj::Own<kj::_::PromiseNode>>>(promises);
  Array<kj::Own<kj::_::PromiseNode>_>::Array(&local_38,other);
  resultParts_00 = Array<kj::_::ExceptionOr<int>_>::begin(resultParts);
  ArrayJoinPromiseNodeBase::ArrayJoinPromiseNodeBase
            (&this->super_ArrayJoinPromiseNodeBase,&local_38,&resultParts_00->super_ExceptionOrValue
             ,0x168);
  Array<kj::Own<kj::_::PromiseNode>_>::~Array(&local_38);
  (this->super_ArrayJoinPromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_007c6ec0;
  other_00 = mv<kj::Array<kj::_::ExceptionOr<int>>>(resultParts);
  Array<kj::_::ExceptionOr<int>_>::Array(&this->resultParts,other_00);
  return;
}

Assistant:

ArrayJoinPromiseNode(Array<Own<PromiseNode>> promises,
                       Array<ExceptionOr<T>> resultParts)
      : ArrayJoinPromiseNodeBase(kj::mv(promises), resultParts.begin(), sizeof(ExceptionOr<T>)),
        resultParts(kj::mv(resultParts)) {}